

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O1

bool __thiscall
SVGChart::LogTickIterator::GetNextTick
          (LogTickIterator *this,float *outTick,bool *outIsMajorTick,string *outFormatString)

{
  AxisSetup *pAVar1;
  char *pcVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  char theBuf [128];
  char local_a8 [136];
  
  pAVar1 = (this->super_TickIterator).mAxisSetup;
  if ((pAVar1 == (AxisSetup *)0x0) || (fVar7 = this->mCurrentTick, pAVar1->mMax * 1.0001 < fVar7)) {
    bVar3 = false;
  }
  else {
    *outTick = fVar7;
    *outIsMajorTick = this->mCount % (long)(pAVar1->mTickInfo).mTickDivision == 0;
    TickInfo::MakeFormatString(fVar7,outFormatString);
    fVar7 = ((this->super_TickIterator).mAxisSetup)->mLogBase;
    fVar4 = 1e-10;
    if (1e-10 <= this->mCurrentTick) {
      fVar4 = this->mCurrentTick;
    }
    fVar4 = log10f(fVar4);
    fVar5 = log10f(fVar7);
    fVar6 = floorf(fVar4 / fVar5);
    fVar8 = (float)(int)fVar6;
    *outIsMajorTick = ABS(fVar4 / fVar5 - fVar8) < 0.0001;
    if (1 < ((this->super_TickIterator).mAxisSetup)->mLogFactor) {
      snprintf(local_a8,0x80,"%d",(ulong)(uint)((int)fVar6 * 0x14));
      pcVar2 = (char *)outFormatString->_M_string_length;
      strlen(local_a8);
      std::__cxx11::string::_M_replace((ulong)outFormatString,0,pcVar2,(ulong)local_a8);
    }
    fVar4 = this->mDelta;
    fVar5 = 1e+10;
    if (fVar8 <= 1e+10) {
      fVar5 = fVar8;
    }
    fVar7 = powf(fVar7,fVar5);
    this->mCurrentTick = fVar7 * fVar4 + this->mCurrentTick;
    this->mCount = this->mCount + 1;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool LogTickIterator::GetNextTick (float &outTick, bool &outIsMajorTick, string &outFormatString) {
      if (!mAxisSetup) {
        return false;
      }
      if (mCurrentTick>mAxisSetup->mMax*kLittleIncrease) {
        return false;
      }
      outTick = mCurrentTick;
      outIsMajorTick = (mCount%mAxisSetup->mTickInfo.mTickDivision == 0);
      TickInfo::MakeFormatString (outTick, outFormatString);
      float theBase = mAxisSetup->mLogBase;
      float theLogFac = 1;//mAxisSetup->mLogFactor;
      float theLogNow = SafeLog(mCurrentTick, theBase, theLogFac);
      int thePowNow = (int)floor(theLogNow);
      outIsMajorTick = false;
      if (fabs (theLogNow-thePowNow)<kEps) {
        outIsMajorTick = true;
      }

      if (mAxisSetup->mLogFactor>1) {
        char theBuf[128];
        snprintf (theBuf, 128, "%d", thePowNow*20);
        outFormatString = theBuf;
      }

      mCurrentTick += mDelta*SafeExp (thePowNow, theBase, theLogFac);
      mCount++;

      return true;
    }